

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

int run_normal_process(ThreadedReplayer *replayer,
                      vector<const_char_*,_std::allocator<const_char_*>_> *databases,char *whitelist
                      ,uint32_t whitelist_mask,intptr_t metadata_handle)

{
  Hash *__args;
  pointer *this;
  ResourceTag RVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  char *pcVar5;
  pointer puVar6;
  DatabaseInterface *pDVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  size_type sVar11;
  size_type sVar12;
  __int_type_conflict1 _Var13;
  bool bVar14;
  FILE *__stream;
  pointer ppcVar15;
  pointer pEVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  undefined4 extraout_var;
  pointer extraout_RAX;
  undefined4 extraout_var_00;
  ScratchAllocator *pSVar22;
  ulong uVar23;
  size_t sVar24;
  long lVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  uint uVar29;
  iterator __position;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_01;
  __hashtable *__this;
  pointer puVar30;
  ulong uVar31;
  pointer puVar32;
  pointer ppcVar33;
  ulong uVar34;
  EnqueuedWork *work;
  pointer pEVar35;
  pointer pEVar36;
  size_t sVar37;
  __normal_iterator<EnqueuedWork_*,_std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>_> __i;
  uint *puVar38;
  pointer pEVar39;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var40;
  pointer pEVar41;
  long in_FS_OFFSET;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> graphics_workload;
  vector<unsigned_long,_std::allocator<unsigned_long>_> graphics_hashes;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  resolver;
  StateReplayer state_replayer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> raytracing_hashes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> compute_hashes;
  size_t resource_hash_count_1;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> raytracing_workload;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> compute_workload;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  vector<unsigned_long,_std::allocator<unsigned_long>_> resource_hashes;
  uint local_1a8;
  uint local_1a4;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> local_198;
  uint local_17c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  long local_158;
  vector<const_char_*,_std::allocator<const_char_*>_> local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  pointer local_f8;
  ulong local_f0;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> local_e8;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  unsigned_long local_38;
  
  local_40 = std::chrono::_V2::steady_clock::now();
  local_48 = std::chrono::_V2::steady_clock::now();
  create_database(&local_150);
  ppcVar15 = local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (whitelist == (char *)0x0) {
LAB_00135a2b:
    bVar17 = Fossilize::DatabaseInterface::metadata_handle_is_valid(metadata_handle);
    if ((!bVar17) ||
       (bVar17 = Fossilize::DatabaseInterface::import_metadata_from_os_handle
                           ((DatabaseInterface *)
                            local_150.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start,metadata_handle), bVar17)) {
      lVar20 = std::chrono::_V2::steady_clock::now();
      lVar21 = std::chrono::_V2::steady_clock::now();
      ppcVar15 = local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      iVar19 = (*(*(_func_int ***)
                   local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_start)[2])
                         (local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      if ((char)iVar19 != '\0') {
        local_58 = lVar21;
        local_50 = lVar20;
        local_60 = std::chrono::_V2::steady_clock::now();
        this = &local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
        Fossilize::StateReplayer::StateReplayer((StateReplayer *)this);
        Fossilize::StateReplayer::set_resolve_derivative_pipeline_handles
                  ((StateReplayer *)this,false);
        Fossilize::StateReplayer::set_resolve_shader_module_handles((StateReplayer *)this,false);
        replayer->global_replayer = (StateReplayer *)this;
        replayer->global_database = (DatabaseInterface *)ppcVar15;
        bVar17 = ThreadedReplayer::init_implicit_whitelist(replayer);
        if (bVar17) {
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ppcVar33 = (pointer)0x0;
          do {
            local_158 = std::chrono::_V2::steady_clock::now();
            local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            RVar1 = *(ResourceTag *)(ppcVar33 + 0x47e16);
            iVar19 = (*(*(_func_int ***)ppcVar15)[6])(ppcVar15,(ulong)RVar1,&local_198,0);
            if ((char)iVar19 == '\0') {
LAB_00136302:
              run_normal_process();
LAB_0013630c:
              iVar19 = 1;
              goto LAB_00136311;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                      (&local_88,
                       (size_type)
                       local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                       _M_impl.super__Vector_impl_data._M_start);
            iVar19 = (*(*(_func_int ***)ppcVar15)[6])
                               (ppcVar15,(ulong)RVar1,&local_198,
                                local_88.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            if ((char)iVar19 == '\0') goto LAB_00136302;
            (replayer->per_thread_data).
            super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
            ._M_impl.super__Vector_impl_data._M_start[*(uint *)(in_FS_OFFSET + -0x18)].expected_tag
                 = RVar1;
            bVar17 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start ==
                     local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish = ppcVar33;
            local_f8 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            puVar30 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            while (!bVar17) {
              local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (unsigned_long *)0x0;
              (*(*(_func_int ***)ppcVar15)[3])(ppcVar15,(ulong)RVar1,*puVar30,&local_178,0,1);
              iVar19 = (*(*(_func_int ***)ppcVar15)[3])
                                 (ppcVar15,(ulong)RVar1,*puVar30,&local_178,0,0);
              if ((char)iVar19 == '\0') {
                run_normal_process();
LAB_00135cbe:
                bVar14 = false;
LAB_00135cec:
                fflush(_stderr);
              }
              else {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_a8,
                           (size_type)
                           local_178.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
                iVar19 = (*(*(_func_int ***)ppcVar15)[3])
                                   (ppcVar15,(ulong)RVar1,*puVar30,&local_178,
                                    local_a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0);
                if ((char)iVar19 == '\0') {
                  run_normal_process();
                  goto LAB_00135cbe;
                }
                bVar18 = Fossilize::StateReplayer::parse
                                   ((StateReplayer *)
                                    &local_150.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &replayer->super_StateCreatorInterface,
                                    (DatabaseInterface *)ppcVar15,
                                    local_a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_a8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_a8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                bVar14 = true;
                if (!bVar18) {
                  fprintf(_stderr,
                          "Fossilize WARN: Did not replay blob (tag: %s, hash: %016lx). See previous logs for context.\n"
                          ,run_normal_process::tag_names[RVar1],*puVar30);
                  bVar14 = true;
                  goto LAB_00135cec;
                }
              }
              if (!bVar14) break;
              puVar30 = puVar30 + 1;
              bVar17 = puVar30 == local_f8;
            }
            if (!bVar17) goto LAB_0013630c;
            if (RVar1 == RESOURCE_APPLICATION_INFO) {
              (*(replayer->super_StateCreatorInterface)._vptr_StateCreatorInterface[2])
                        (replayer,0,0,0);
            }
            pcVar5 = run_normal_process::tag_names[RVar1];
            fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",
                    pcVar5);
            fflush(_stderr);
            lVar20 = std::chrono::_V2::steady_clock::now();
            fprintf(_stderr,"Fossilize INFO: Total time decoding %s in main thread: %.3f s\n",
                    (double)(lVar20 - local_158) * 1e-09,pcVar5);
            fflush(_stderr);
            if (!bVar17) goto LAB_0013630c;
            ppcVar33 = (pointer)((long)local_150.
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4);
          } while (ppcVar33 != (pointer)0x10);
          if (-1 < crash_fd) {
            write_all(crash_fd,"HEARTBEAT\n");
          }
          ThreadedReplayer::start_worker_threads(replayer);
          ppcVar15 = local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (unsigned_long *)0x0;
          local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
          local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (unsigned_long *)0x0;
          local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
          local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (unsigned_long *)0x0;
          local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
          if ((replayer->opts).pipeline_hash == 0) {
            local_68 = replayer->cached_blobs;
            local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1a8 = 0;
            local_1a4 = 0;
            local_17c = 0;
            lVar20 = 0;
            do {
              this_00 = &local_178;
              local_f0 = 0;
              uVar2 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                                      ::stat_tags + lVar20);
              uVar23 = (ulong)uVar2;
              iVar19 = (*(*(_func_int ***)ppcVar15)[6])(ppcVar15,(ulong)uVar2,&local_f0,0);
              if ((char)iVar19 == '\0') {
                run_normal_process();
                bVar17 = false;
LAB_0013625c:
                iVar19 = fflush(_stderr);
                puVar32 = (pointer)CONCAT44(extraout_var_00,iVar19);
              }
              else {
                uVar29 = (uint)local_f0;
                if (uVar23 == 9) {
                  uVar2 = (replayer->opts).start_raytracing_index;
                  uVar3 = (replayer->opts).end_raytracing_index;
                  uVar31 = (ulong)uVar3;
                  if (uVar29 <= uVar3) {
                    uVar31 = local_f0 & 0xffffffff;
                  }
                  uVar34 = (ulong)uVar2;
                  if ((uint)uVar31 <= uVar2) {
                    uVar34 = uVar31;
                  }
                  this_00 = &local_138;
                  local_17c = (uint)uVar34;
                }
                else if (uVar2 == 7) {
                  uVar2 = (replayer->opts).start_compute_index;
                  uVar3 = (replayer->opts).end_compute_index;
                  uVar31 = (ulong)uVar3;
                  if (uVar29 <= uVar3) {
                    uVar31 = local_f0 & 0xffffffff;
                  }
                  uVar34 = (ulong)uVar2;
                  if ((uint)uVar31 <= uVar2) {
                    uVar34 = uVar31;
                  }
                  this_00 = &local_118;
                  local_1a4 = (uint)uVar34;
                }
                else if (uVar2 == 6) {
                  uVar2 = (replayer->opts).start_graphics_index;
                  uVar3 = (replayer->opts).end_graphics_index;
                  uVar31 = (ulong)uVar3;
                  if (uVar29 <= uVar3) {
                    uVar31 = local_f0 & 0xffffffff;
                  }
                  uVar34 = (ulong)uVar2;
                  if ((uint)uVar31 <= uVar2) {
                    uVar34 = uVar31;
                  }
                  local_1a8 = (uint)uVar34;
                }
                else {
                  uVar34 = 0;
                  uVar31 = local_f0 & 0xffffffff;
                  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
                }
                local_158 = lVar20;
                if (this_00 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
                  __assert_fail("hashes",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp"
                                ,0xf3e,
                                "int run_normal_process(ThreadedReplayer &, const vector<const char *> &, const char *, uint32_t, intptr_t)"
                               );
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,local_f0)
                ;
                iVar19 = (*(*(_func_int ***)ppcVar15)[6])(ppcVar15,uVar23,&local_f0);
                if ((char)iVar19 == '\0') {
                  run_normal_process();
                  bVar17 = false;
                  lVar20 = local_158;
                  goto LAB_0013625c;
                }
                sVar28 = uVar31 * 8 + uVar34 * -8;
                if (sVar28 != 0) {
                  puVar30 = (this_00->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  memmove(puVar30,puVar30 + uVar34,sVar28);
                }
                puVar32 = (this_00->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + (uint)((int)uVar31 - (int)uVar34);
                puVar30 = (this_00->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish;
                if (puVar32 != puVar30) {
                  sVar28 = (long)(this_00->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar30;
                  if (sVar28 != 0) {
                    memmove(puVar32,puVar30,sVar28);
                  }
                  puVar6 = (this_00->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                  puVar32 = (pointer)((long)puVar32 + ((long)puVar6 - (long)puVar30));
                  if (puVar6 != puVar32) {
                    (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish = puVar32;
                  }
                }
                pDVar7 = (replayer->replayer_cache_db)._M_t.
                         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
                if (pDVar7 != (DatabaseInterface *)0x0) {
                  local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  iVar19 = (*pDVar7->_vptr_DatabaseInterface[6])(pDVar7,uVar23,&local_e8);
                  if (((char)iVar19 != '\0') &&
                     (local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198,
                               (size_type)
                               local_e8.
                               super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                               _M_impl.super__Vector_impl_data._M_start);
                    iVar19 = (*pDVar7->_vptr_DatabaseInterface[6])(pDVar7,uVar23,&local_e8);
                    if ((char)iVar19 != '\0') {
                      p_Var40 = &local_68[uVar23]._M_h;
                      auVar43._0_8_ =
                           (double)CONCAT44(0x43300000,
                                            (int)local_e8.
                                                 super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                      auVar43._8_4_ =
                           (int)((ulong)local_e8.
                                        super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 0x20);
                      auVar43._12_4_ = 0x45300000;
                      dVar42 = ceil(((auVar43._8_8_ - 1.9342813113834067e+25) +
                                    (auVar43._0_8_ - 4503599627370496.0)) /
                                    (double)(p_Var40->_M_rehash_policy)._M_max_load_factor);
                      std::
                      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::rehash(p_Var40,(long)(dVar42 - 9.223372036854776e+18) & (long)dVar42 >> 0x3f
                                       | (long)dVar42);
                      pEVar36 = local_198.
                                super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                      for (pEVar35 = local_198.
                                     super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>
                                     ._M_impl.super__Vector_impl_data._M_start; pEVar35 != pEVar36;
                          pEVar35 = (pointer)&pEVar35->func) {
                        local_38 = *(unsigned_long *)pEVar35;
                        local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)p_Var40;
                        std::
                        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)p_Var40,&local_38,&local_c8);
                      }
                    }
                  }
                  if (local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_198.
                                    super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_198.
                                          super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_198.
                                          super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                puVar30 = (this_00->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                puVar32 = (this_00->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish;
                bVar17 = puVar30 == puVar32;
                local_f8 = puVar32;
                while (!bVar17) {
                  local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  (*(*(_func_int ***)ppcVar15)[3])(ppcVar15,uVar23,*puVar30,&local_198,0,1);
                  iVar19 = (*(*(_func_int ***)ppcVar15)[3])(ppcVar15,uVar23,*puVar30,&local_198,0,0)
                  ;
                  puVar32 = (pointer)CONCAT44(extraout_var,iVar19);
                  if ((char)iVar19 == '\0') {
                    run_normal_process();
                    puVar32 = extraout_RAX;
                    break;
                  }
                  puVar30 = puVar30 + 1;
                  bVar17 = puVar30 == local_f8;
                }
                if (bVar17) {
                  fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n"
                          ,run_normal_process::tag_names[uVar23]);
                  bVar17 = true;
                  lVar20 = local_158;
                  goto LAB_0013625c;
                }
                bVar17 = false;
                lVar20 = local_158;
              }
              if (!bVar17) break;
              lVar20 = lVar20 + 4;
              local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT71((int7)((ulong)puVar32 >> 8),lVar20 == 0xc);
            } while (lVar20 != 0xc);
            iVar19 = 1;
            if (((ulong)local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 1) != 0) goto LAB_001364f9;
          }
          else {
            __args = &(replayer->opts).pipeline_hash;
            lVar20 = 0;
            do {
              local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              uVar2 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                                      ::stat_tags + lVar20);
              iVar19 = (*(*(_func_int ***)ppcVar15)[3])
                                 (ppcVar15,(ulong)uVar2,*__args,&local_198,0,0);
              if ((char)iVar19 != '\0') {
                if (uVar2 == 9) {
                  __position._M_current =
                       local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  this_01 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_138;
                  if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0013645d:
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>(this_01,__position,__args);
                  }
                  else {
                    *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish = *__args;
                    local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                }
                else if (uVar2 == 7) {
                  if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    __position._M_current =
                         local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    this_01 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_118;
                    goto LAB_0013645d;
                  }
                  *local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = *__args;
                  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                else if (uVar2 == 6) {
                  if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    __position._M_current =
                         local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    this_01 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_178;
                    goto LAB_0013645d;
                  }
                  *local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = *__args;
                  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              lVar20 = lVar20 + 4;
            } while (lVar20 != 0xc);
            local_17c = 0;
            if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                local_1a4 = 0;
                local_1a8 = 0;
                if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  run_normal_process();
                  iVar19 = 1;
                  goto LAB_00136299;
                }
              }
              else {
                local_1a4 = 0;
                local_1a8 = 0;
              }
            }
            else {
              local_1a4 = 0;
              local_1a8 = 0;
            }
LAB_001364f9:
            pSVar22 = Fossilize::StateReplayer::get_allocator
                                ((StateReplayer *)
                                 &local_150.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            Fossilize::ScratchAllocator::reset(pSVar22);
            local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>
                      (replayer,replayer->deferred_graphics,&replayer->graphics_pipelines,
                       &replayer->graphics_parents,&local_198,&local_178,local_1a8);
            ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredComputeInfo>
                      (replayer,replayer->deferred_compute,&replayer->compute_pipelines,
                       &replayer->compute_parents,&local_c8,&local_118,local_1a4);
            ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>
                      (replayer,replayer->deferred_raytracing,&replayer->raytracing_pipelines,
                       &replayer->raytracing_parents,&local_e8,&local_138,local_17c);
            pEVar35 = local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pEVar36 = local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              lVar21 = (long)local_198.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_198.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_start;
              uVar23 = (lVar21 >> 3) * -0x3333333333333333;
              lVar20 = 0x3f;
              if (uVar23 != 0) {
                for (; uVar23 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                        (local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e)
              ;
              if (lVar21 < 0x281) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                          (pEVar36,pEVar35);
              }
              else {
                pEVar39 = pEVar36 + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                          (pEVar36,pEVar39);
                for (; pEVar39 != pEVar35; pEVar39 = pEVar39 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                            (pEVar39);
                }
              }
            }
            pEVar35 = local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pEVar36 = local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              lVar21 = (long)local_c8.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_c8.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_start;
              uVar23 = (lVar21 >> 3) * -0x3333333333333333;
              lVar20 = 0x3f;
              if (uVar23 != 0) {
                for (; uVar23 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                        (local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e)
              ;
              if (lVar21 < 0x281) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                          (pEVar36,pEVar35);
              }
              else {
                p_Var40 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)((long)pEVar36 + 0x268))->_M_element_count;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                          (pEVar36,p_Var40);
                for (; p_Var40 !=
                       (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)pEVar35;
                    p_Var40 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)&(p_Var40->_M_rehash_policy)._M_next_resize) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                            (p_Var40);
                }
              }
            }
            pEVar16 = local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pEVar39 = local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pEVar36 = local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pEVar35 = local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              lVar21 = (long)local_e8.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_e8.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_start;
              uVar23 = (lVar21 >> 3) * -0x3333333333333333;
              lVar20 = 0x3f;
              if (uVar23 != 0) {
                for (; uVar23 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                        (local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e)
              ;
              if (lVar21 < 0x281) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                          (pEVar39,pEVar16);
                pEVar36 = local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pEVar35 = local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                pEVar41 = pEVar39 + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                          (pEVar39,pEVar41);
                for (; pEVar36 = local_198.
                                 super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                    pEVar35 = local_198.
                              super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                              _M_impl.super__Vector_impl_data._M_finish, pEVar41 != pEVar16;
                    pEVar41 = pEVar41 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                            (pEVar41);
                }
              }
            }
            for (; pEVar39 = local_198.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_finish,
                pEVar36 !=
                local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_finish; pEVar36 = pEVar36 + 1) {
              local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
              super__Vector_impl_data._M_finish = pEVar35;
              if ((pEVar36->func).super__Function_base._M_manager == (_Manager_type)0x0)
              goto LAB_00136d40;
              (*(pEVar36->func)._M_invoker)((_Any_data *)&pEVar36->func);
              if (-1 < crash_fd) {
                write_all(crash_fd,"HEARTBEAT\n");
              }
              pEVar35 = local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
              super__Vector_impl_data._M_finish = pEVar39;
            }
            local_198.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish = pEVar35;
            ThreadedReplayer::sync_worker_threads(replayer);
            pEVar36 = local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (p_Var40 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_c8.
                              super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                p_Var40 !=
                (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)pEVar36;
                p_Var40 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&(p_Var40->_M_rehash_policy)._M_next_resize) {
              if (p_Var40->_M_element_count == 0) goto LAB_00136d40;
              (**(code **)&p_Var40->_M_rehash_policy)(&p_Var40->_M_bucket_count);
              if (-1 < crash_fd) {
                write_all(crash_fd,"HEARTBEAT\n");
              }
            }
            ThreadedReplayer::sync_worker_threads(replayer);
            pEVar35 = local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (pEVar36 = local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                           _M_impl.super__Vector_impl_data._M_start; pEVar36 != pEVar35;
                pEVar36 = pEVar36 + 1) {
              if ((pEVar36->func).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00136d40:
                std::__throw_bad_function_call();
              }
              (*(pEVar36->func)._M_invoker)((_Any_data *)&pEVar36->func);
              if (-1 < crash_fd) {
                write_all(crash_fd,"HEARTBEAT\n");
              }
            }
            ThreadedReplayer::sync_worker_threads(replayer);
            ThreadedReplayer::tear_down_threads(replayer);
            iVar19 = 0;
            fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",
                    "Shader Module",
                    (replayer->shader_module_total_size).super___atomic_base<unsigned_long>._M_i,
                    (replayer->shader_module_total_compressed_size).
                    super___atomic_base<unsigned_long>._M_i);
            fflush(_stderr);
            sVar24 = replayer->compute_pipelines_cleared +
                     (replayer->compute_pipelines)._M_h._M_element_count;
            replayer->compute_pipelines_cleared = sVar24;
            sVar37 = replayer->graphics_pipelines_cleared +
                     (replayer->graphics_pipelines)._M_h._M_element_count;
            replayer->graphics_pipelines_cleared = sVar37;
            sVar27 = replayer->raytracing_pipelines_cleared +
                     (replayer->raytracing_pipelines)._M_h._M_element_count;
            replayer->raytracing_pipelines_cleared = sVar27;
            sVar8 = (replayer->samplers)._M_h._M_element_count;
            sVar9 = (replayer->layouts)._M_h._M_element_count;
            sVar10 = (replayer->pipeline_layouts)._M_h._M_element_count;
            sVar11 = (replayer->shader_modules).hash_to_objects._M_h._M_element_count;
            sVar12 = (replayer->render_passes)._M_h._M_element_count;
            lVar20 = local_60 - local_58;
            lVar21 = local_50 - local_48;
            lVar25 = std::chrono::_V2::steady_clock::now();
            lVar25 = lVar25 - local_40;
            fprintf(_stderr,"Fossilize INFO: Opening archive took %ld ms:\n",lVar21 / 1000000);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO: Parsing archive took %ld ms:\n",lVar20 / 1000000);
            fflush(_stderr);
            if (((replayer->opts).on_disk_pipeline_cache_path._M_string_length != 0) &&
               (((replayer->device)._M_t.
                 super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                 .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                supports_pipeline_feedback == true)) {
              run_normal_process();
            }
            _Var13 = (replayer->shader_module_ns).super___atomic_base<unsigned_long>._M_i;
            auVar44._8_4_ = (int)(_Var13 >> 0x20);
            auVar44._0_8_ = _Var13;
            auVar44._12_4_ = 0x45300000;
            fprintf(_stderr,
                    "Fossilize INFO: Playing back %u shader modules took %.3f s (accumulated time)\n"
                    ,((auVar44._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)_Var13) - 4503599627370496.0)) * 1e-09,
                    (ulong)(replayer->shader_module_count).super___atomic_base<unsigned_int>._M_i);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO: Shader cache evicted %u shader modules in total\n",
                    (ulong)(replayer->shader_module_evicted_count).super___atomic_base<unsigned_int>
                           ._M_i);
            fflush(_stderr);
            _Var13 = (replayer->graphics_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
            auVar45._8_4_ = (int)(_Var13 >> 0x20);
            auVar45._0_8_ = _Var13;
            auVar45._12_4_ = 0x45300000;
            fprintf(_stderr,
                    "Fossilize INFO: Playing back %u graphics pipelines took %.3f s (accumulated time)\n"
                    ,((auVar45._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)_Var13) - 4503599627370496.0)) * 1e-09,
                    (ulong)(replayer->graphics_pipeline_count).super___atomic_base<unsigned_int>.
                           _M_i);
            fflush(_stderr);
            _Var13 = (replayer->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
            auVar46._8_4_ = (int)(_Var13 >> 0x20);
            auVar46._0_8_ = _Var13;
            auVar46._12_4_ = 0x45300000;
            fprintf(_stderr,
                    "Fossilize INFO: Playing back %u compute pipelines took %.3f s (accumulated time)\n"
                    ,((auVar46._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)_Var13) - 4503599627370496.0)) * 1e-09,
                    (ulong)(replayer->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i
                   );
            fflush(_stderr);
            _Var13 = (replayer->raytracing_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
            auVar47._8_4_ = (int)(_Var13 >> 0x20);
            auVar47._0_8_ = _Var13;
            auVar47._12_4_ = 0x45300000;
            fprintf(_stderr,
                    "Fossilize INFO: Playing back %u raytracing pipelines took %.3f s (accumulated time)\n"
                    ,((auVar47._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)_Var13) - 4503599627370496.0)) * 1e-09,
                    (ulong)(replayer->raytracing_pipeline_count).super___atomic_base<unsigned_int>.
                           _M_i);
            fflush(_stderr);
            _Var13 = (replayer->total_idle_ns).super___atomic_base<unsigned_long>._M_i;
            auVar48._8_4_ = (int)(_Var13 >> 0x20);
            auVar48._0_8_ = _Var13;
            auVar48._12_4_ = 0x45300000;
            fprintf(_stderr,
                    "Fossilize INFO: Threads were idling in total for %.3f s (accumulated time)\n",
                    ((auVar48._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)_Var13) - 4503599627370496.0)) * 1e-09);
            fflush(_stderr);
            _Var13 = (replayer->thread_total_ns).super___atomic_base<unsigned_long>._M_i;
            auVar49._8_4_ = (int)(_Var13 >> 0x20);
            auVar49._0_8_ = _Var13;
            auVar49._12_4_ = 0x45300000;
            fprintf(_stderr,
                    "Fossilize INFO: Threads were active in total for %.3f s (accumulated time)\n",
                    ((auVar49._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)_Var13) - 4503599627370496.0)) * 1e-09);
            fflush(_stderr);
            __stream = _stderr;
            _Var13 = (replayer->total_peak_memory).super___atomic_base<unsigned_long>._M_i;
            pSVar22 = Fossilize::StateReplayer::get_allocator
                                ((StateReplayer *)
                                 &local_150.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            sVar26 = Fossilize::ScratchAllocator::get_peak_memory_consumption(pSVar22);
            lVar20 = sVar26 + _Var13;
            auVar50._8_4_ = (int)((ulong)lVar20 >> 0x20);
            auVar50._0_8_ = lVar20;
            auVar50._12_4_ = 0x45300000;
            fprintf(__stream,"Fossilize INFO: Total peak memory consumption by parser: %.3f MB.\n",
                    ((auVar50._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)) * 1e-06);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO: Replayed %lu objects in %ld ms:\n",
                    sVar37 + sVar24 + sVar27 + sVar8 + sVar9 + sVar10 + sVar11 + sVar12,
                    lVar25 / 1000000);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO:   samplers:              %7lu\n",
                    (replayer->samplers)._M_h._M_element_count);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO:   descriptor set layouts:%7lu\n",
                    (replayer->layouts)._M_h._M_element_count);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO:   pipeline layouts:      %7lu\n",
                    (replayer->pipeline_layouts)._M_h._M_element_count);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO:   render passes:         %7lu\n",
                    (replayer->render_passes)._M_h._M_element_count);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO:   compute pipelines:     %7lu\n",
                    replayer->compute_pipelines_cleared);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO:   graphics pipelines:    %7lu\n",
                    replayer->graphics_pipelines_cleared);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize INFO:   raytracing pipelines:  %7lu\n",
                    replayer->raytracing_pipelines_cleared);
            fflush(_stderr);
            std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&local_e8);
            std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&local_c8);
            std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&local_198);
          }
LAB_00136299:
          if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
            operator_delete(local_138.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_138.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_138.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
            operator_delete(local_118.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_118.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
            operator_delete(local_178.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_178.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_178.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
LAB_00136311:
          if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          run_normal_process();
          iVar19 = 1;
        }
        Fossilize::StateReplayer::~StateReplayer
                  ((StateReplayer *)
                   &local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        goto LAB_00136358;
      }
      run_normal_process();
    }
    else {
      run_normal_process();
    }
  }
  else {
    Fossilize::DatabaseInterface::set_whitelist_tag_mask
              ((DatabaseInterface *)
               local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start,whitelist_mask);
    bVar17 = Fossilize::DatabaseInterface::load_whitelist_database
                       ((DatabaseInterface *)ppcVar15,whitelist);
    if (bVar17) {
      iVar19 = (*(*(_func_int ***)ppcVar15)[10])(ppcVar15);
      if ((char)iVar19 != '\0') {
        puVar4 = (replayer->opts).implicit_whitelist_database_indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar38 = (replayer->opts).implicit_whitelist_database_indices.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar38 != puVar4; puVar38 = puVar38 + 1) {
          Fossilize::DatabaseInterface::promote_sub_database_to_whitelist
                    ((DatabaseInterface *)ppcVar15,*puVar38);
        }
      }
      goto LAB_00135a2b;
    }
    run_normal_process();
  }
  iVar19 = 1;
LAB_00136358:
  if ((DatabaseInterface *)
      local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (DatabaseInterface *)0x0) {
    (*(*(_func_int ***)
        local_150.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start)[1])();
  }
  return iVar19;
}

Assistant:

static int run_normal_process(ThreadedReplayer &replayer, const vector<const char *> &databases,
                              const char *whitelist, uint32_t whitelist_mask,
                              intptr_t metadata_handle)
{
	auto start_time = chrono::steady_clock::now();
	auto start_create_archive = chrono::steady_clock::now();
	auto resolver = create_database(databases);

	if (whitelist)
	{
		resolver->set_whitelist_tag_mask(whitelist_mask);
		if (!resolver->load_whitelist_database(whitelist))
		{
			LOGE("Failed to load whitelist database: %s.\n", whitelist);
			return EXIT_FAILURE;
		}

		if (resolver->has_sub_databases())
			for (unsigned index : replayer.opts.implicit_whitelist_database_indices)
				resolver->promote_sub_database_to_whitelist(index);
	}

	if (DatabaseInterface::metadata_handle_is_valid(metadata_handle))
	{
		if (!resolver->import_metadata_from_os_handle(metadata_handle))
		{
			LOGE("Failed to import metadata.\n");
			return EXIT_FAILURE;
		}
	}

	auto end_create_archive = chrono::steady_clock::now();

	auto start_prepare = chrono::steady_clock::now();
	if (!resolver->prepare())
	{
		LOGE("Failed to prepare database.\n");
		return EXIT_FAILURE;
	}
	auto end_prepare = chrono::steady_clock::now();

	StateReplayer state_replayer;
	state_replayer.set_resolve_derivative_pipeline_handles(false);
	state_replayer.set_resolve_shader_module_handles(false);
	replayer.global_replayer = &state_replayer;
	replayer.global_database = resolver.get();

	if (!replayer.init_implicit_whitelist())
	{
		LOGE("Failed to initialize implicit whitelist.\n");
		return EXIT_FAILURE;
	}

	vector<Hash> resource_hashes;
	vector<uint8_t> state_json;

	static const ResourceTag initial_playback_order[] = {
		RESOURCE_APPLICATION_INFO, // This will create the device, etc.
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Trivial, run in main thread. Dependent immutable samplers are pulled in on-demand.
		RESOURCE_PIPELINE_LAYOUT, // Trivial, run in main thread
		RESOURCE_RENDER_PASS, // Trivial, run in main thread
	};

	static const ResourceTag threaded_playback_order[] = {
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Info Links",
		"Raytracing Pipeline",
	};

	for (auto &tag : initial_playback_order)
	{
		auto main_thread_start = std::chrono::steady_clock::now();
		size_t tag_total_size = 0;
		size_t tag_total_size_compressed = 0;
		size_t resource_hash_count = 0;

		if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, nullptr))
		{
			LOGE("Failed to get list of resource hashes.\n");
			return EXIT_FAILURE;
		}

		resource_hashes.resize(resource_hash_count);

		if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, resource_hashes.data()))
		{
			LOGE("Failed to get list of resource hashes.\n");
			return EXIT_FAILURE;
		}

		auto &per_thread_data = replayer.get_per_thread_data();
		per_thread_data.expected_tag = tag;

		for (auto &hash : resource_hashes)
		{
			size_t state_json_size = 0;
			if (resolver->read_entry(tag, hash, &state_json_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
			{
				tag_total_size_compressed += state_json_size;
			}			

			if (!resolver->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);
			tag_total_size += state_json_size;

			if (!resolver->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			if (!state_replayer.parse(replayer, resolver.get(), state_json.data(), state_json.size()))
				LOGW("Did not replay blob (tag: %s, hash: %016" PRIx64 "). See previous logs for context.\n", tag_names[tag], hash);
		}

		if (tag == RESOURCE_APPLICATION_INFO)
		{
			// Just in case there was no application info in the database, we provide a dummy info,
			// this makes sure the VkDevice is created.
			replayer.set_application_info(0, nullptr, nullptr);
		}

		LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[tag],
		     uint64_t(tag_total_size),
		     uint64_t(tag_total_size_compressed));

		auto main_thread_end = std::chrono::steady_clock::now();
		auto duration = std::chrono::duration_cast<std::chrono::nanoseconds>(main_thread_end - main_thread_start).count();
		LOGI("Total time decoding %s in main thread: %.3f s\n", tag_names[tag], duration * 1e-9);
	}

	heartbeat();

	// Now we've laid the initial ground work, kick off worker threads.
	replayer.start_worker_threads();

	vector<Hash> graphics_hashes;
	vector<Hash> compute_hashes;
	vector<Hash> raytracing_hashes;
	unsigned graphics_start_index = 0;
	unsigned compute_start_index = 0;
	unsigned raytracing_start_index = 0;

	if (replayer.opts.pipeline_hash != 0)
	{
		for (auto &tag : threaded_playback_order)
		{
			size_t state_json_size = 0;
			if (resolver->read_entry(tag, replayer.opts.pipeline_hash, &state_json_size, nullptr, 0))
			{
				if (tag == RESOURCE_GRAPHICS_PIPELINE)
					graphics_hashes.push_back(replayer.opts.pipeline_hash);
				else if (tag == RESOURCE_COMPUTE_PIPELINE)
					compute_hashes.push_back(replayer.opts.pipeline_hash);
				else if (tag == RESOURCE_RAYTRACING_PIPELINE)
					raytracing_hashes.push_back(replayer.opts.pipeline_hash);
			}
		}

		if (graphics_hashes.empty() && compute_hashes.empty() && raytracing_hashes.empty())
		{
			LOGE("Specified pipeline hash %016" PRIx64 " not found in database.\n",
			     replayer.opts.pipeline_hash);
			return EXIT_FAILURE;
		}
	}
	else
	{
		for (auto &tag : threaded_playback_order)
		{
			size_t tag_total_size = 0;
			size_t tag_total_size_compressed = 0;
			size_t resource_hash_count = 0;

			if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, nullptr))
			{
				LOGE("Failed to get list of resource hashes.\n");
				return EXIT_FAILURE;
			}

			unsigned start_index = 0;
			unsigned end_index = resource_hash_count;

			vector<Hash> *hashes = nullptr;

			if (tag == RESOURCE_GRAPHICS_PIPELINE)
			{
				hashes = &graphics_hashes;

				end_index = min(end_index, replayer.opts.end_graphics_index);
				start_index = max(start_index, replayer.opts.start_graphics_index);
				start_index = min(end_index, start_index);
				graphics_start_index = start_index;

			}
			else if (tag == RESOURCE_COMPUTE_PIPELINE)
			{
				hashes = &compute_hashes;

				end_index = min(end_index, replayer.opts.end_compute_index);
				start_index = max(start_index, replayer.opts.start_compute_index);
				start_index = min(end_index, start_index);
				compute_start_index = start_index;
			}
			else if (tag == RESOURCE_RAYTRACING_PIPELINE)
			{
				hashes = &raytracing_hashes;

				end_index = min(end_index, replayer.opts.end_raytracing_index);
				start_index = max(start_index, replayer.opts.start_raytracing_index);
				start_index = min(end_index, start_index);
				raytracing_start_index = start_index;
			}

			assert(hashes);
			hashes->resize(resource_hash_count);

			if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, hashes->data()))
			{
				LOGE("Failed to get list of resource hashes.\n");
				return EXIT_FAILURE;
			}

			move(begin(*hashes) + start_index, begin(*hashes) + end_index, begin(*hashes));
			hashes->erase(begin(*hashes) + (end_index - start_index), end(*hashes));

			if (replayer.replayer_cache_db)
				populate_blob_hash_set(replayer.cached_blobs[tag], tag, *replayer.replayer_cache_db);

			for (auto &hash : *hashes)
			{
				size_t state_json_size = 0;
				if (resolver->read_entry(tag, hash, &state_json_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
				{
					tag_total_size_compressed += state_json_size;
				}

				if (!resolver->read_entry(tag, hash, &state_json_size, nullptr, 0))
				{
					LOGE("Failed to load blob from cache.\n");
					return EXIT_FAILURE;
				}
				tag_total_size += state_json_size;
			}

			LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[tag],
			     uint64_t(tag_total_size),
			     uint64_t(tag_total_size_compressed));
		}
	}

	// Done parsing static objects.
	state_replayer.get_allocator().reset();

	vector<EnqueuedWork> graphics_workload;
	vector<EnqueuedWork> compute_workload;
	vector<EnqueuedWork> raytracing_workload;
	replayer.enqueue_deferred_pipelines(replayer.deferred_graphics, replayer.graphics_pipelines, replayer.graphics_parents,
	                                    graphics_workload,
	                                    graphics_hashes, graphics_start_index);
	replayer.enqueue_deferred_pipelines(replayer.deferred_compute, replayer.compute_pipelines, replayer.compute_parents,
	                                    compute_workload, compute_hashes,
	                                    compute_start_index);
	replayer.enqueue_deferred_pipelines(replayer.deferred_raytracing, replayer.raytracing_pipelines, replayer.raytracing_parents,
	                                    raytracing_workload, raytracing_hashes,
	                                    raytracing_start_index);

	sort(begin(graphics_workload), end(graphics_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});
	sort(begin(compute_workload), end(compute_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});
	sort(begin(raytracing_workload), end(raytracing_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});

	const auto run_work = [&replayer](const std::vector<EnqueuedWork> &workload) {
		for (auto &work : workload)
		{
			work.func();
			heartbeat();
		}

		// Need to synchronize worker threads between pipeline types to avoid a race condition
		// where memory iteration 1 for a GPL link is running, and then compute starts running
		// with only memory iteration 0 (< 1024 pipelines).
		// Then we get the pattern of:
		// - Link GPL pipeline iteration 1
		// - Sync memory context 0
		// - LRU maintenance memory context 0
		// - Free pipelines (race condition!)
		// To avoid shenanigans, synchronize everything between types.
		replayer.sync_worker_threads();
	};

	run_work(graphics_workload);
	run_work(compute_workload);
	run_work(raytracing_workload);

	replayer.tear_down_threads();

	LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[RESOURCE_SHADER_MODULE],
	     uint64_t(replayer.shader_module_total_size.load()),
	     uint64_t(replayer.shader_module_total_compressed_size.load()));

	replayer.compute_pipelines_cleared += replayer.compute_pipelines.size();
	replayer.graphics_pipelines_cleared += replayer.graphics_pipelines.size();
	replayer.raytracing_pipelines_cleared += replayer.raytracing_pipelines.size();

	unsigned long total_size =
		replayer.samplers.size() +
		replayer.layouts.size() +
		replayer.pipeline_layouts.size() +
		replayer.shader_modules.get_current_object_count() +
		replayer.render_passes.size() +
		replayer.compute_pipelines_cleared +
		replayer.graphics_pipelines_cleared +
		replayer.raytracing_pipelines_cleared;

	long elapsed_ms_prepare = chrono::duration_cast<chrono::milliseconds>(end_prepare - start_prepare).count();
	long elapsed_ms_read_archive = chrono::duration_cast<chrono::milliseconds>(end_create_archive - start_create_archive).count();
	long elapsed_ms = chrono::duration_cast<chrono::milliseconds>(chrono::steady_clock::now() - start_time).count();

	LOGI("Opening archive took %ld ms:\n", elapsed_ms_read_archive);
	LOGI("Parsing archive took %ld ms:\n", elapsed_ms_prepare);

	if (!replayer.opts.on_disk_pipeline_cache_path.empty() && replayer.device->pipeline_feedback_enabled())
	{
		LOGI("Pipeline cache hits reported: %u\n", replayer.pipeline_cache_hits.load());
		LOGI("Pipeline cache misses reported: %u\n", replayer.pipeline_cache_misses.load());
	}

	LOGI("Playing back %u shader modules took %.3f s (accumulated time)\n",
	     replayer.shader_module_count.load(),
	     replayer.shader_module_ns.load() * 1e-9);

	LOGI("Shader cache evicted %u shader modules in total\n",
	     replayer.shader_module_evicted_count.load());

	LOGI("Playing back %u graphics pipelines took %.3f s (accumulated time)\n",
	     replayer.graphics_pipeline_count.load(),
	     replayer.graphics_pipeline_ns.load() * 1e-9);

	LOGI("Playing back %u compute pipelines took %.3f s (accumulated time)\n",
	     replayer.compute_pipeline_count.load(),
	     replayer.compute_pipeline_ns.load() * 1e-9);

	LOGI("Playing back %u raytracing pipelines took %.3f s (accumulated time)\n",
	     replayer.raytracing_pipeline_count.load(),
	     replayer.raytracing_pipeline_ns.load() * 1e-9);

	LOGI("Threads were idling in total for %.3f s (accumulated time)\n",
	     replayer.total_idle_ns.load() * 1e-9);

	LOGI("Threads were active in total for %.3f s (accumulated time)\n",
	     replayer.thread_total_ns.load() * 1e-9);

	LOGI("Total peak memory consumption by parser: %.3f MB.\n",
	     (replayer.total_peak_memory.load() + state_replayer.get_allocator().get_peak_memory_consumption()) * 1e-6);

	LOGI("Replayed %lu objects in %ld ms:\n", total_size, elapsed_ms);
	LOGI("  samplers:              %7lu\n", (unsigned long)replayer.samplers.size());
	LOGI("  descriptor set layouts:%7lu\n", (unsigned long)replayer.layouts.size());
	LOGI("  pipeline layouts:      %7lu\n", (unsigned long)replayer.pipeline_layouts.size());
	LOGI("  render passes:         %7lu\n", (unsigned long)replayer.render_passes.size());
	LOGI("  compute pipelines:     %7lu\n", (unsigned long)replayer.compute_pipelines_cleared);
	LOGI("  graphics pipelines:    %7lu\n", (unsigned long)replayer.graphics_pipelines_cleared);
	LOGI("  raytracing pipelines:  %7lu\n", (unsigned long)replayer.raytracing_pipelines_cleared);

	return EXIT_SUCCESS;
}